

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O2

boolean attack(monst *mtmp,schar dx,schar dy)

{
  int *piVar1;
  byte *pbVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  permonst *ppVar6;
  int iVar7;
  level *lev;
  boolean bVar8;
  schar sVar9;
  byte bVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  obj *poVar18;
  char *pcVar19;
  char *pcVar20;
  attack *paVar21;
  monst *pmVar22;
  ulong uVar23;
  undefined7 in_register_00000011;
  char dx_00;
  bool bVar24;
  undefined7 in_register_00000031;
  ulong uVar25;
  char cVar26;
  ulong uVar27;
  char *pcVar28;
  obj **ppoVar29;
  uchar uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int dhit;
  uint local_1e8;
  int local_1e4;
  ulong local_1e0;
  uint local_1d8;
  uint local_1d4;
  int local_1d0 [2];
  int sum [6];
  attack alt_attk;
  char buf [256];
  
  uVar27 = CONCAT71(in_register_00000011,dy) & 0xffffffff;
  cVar11 = (char)uVar27;
  uVar25 = CONCAT71(in_register_00000031,dx) & 0xffffffff;
  ppVar6 = mtmp->data;
  if (mtmp->mtame != '\0') {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025e38c;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025e383;
        }
        else {
LAB_0025e383:
          if (ublindf == (obj *)0x0) goto LAB_0025e437;
LAB_0025e38c:
          if (ublindf->oartifact != '\x1d') goto LAB_0025e437;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((ppVar6->mflags3 & 0x200) == 0))
        goto LAB_0025e437;
      }
LAB_0025e3e4:
      uVar13 = *(uint *)&mtmp->field_0x60;
      if ((((uVar13 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar13 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0025e42a;
        goto LAB_0025e437;
      }
      if ((uVar13 & 0x280) != 0) goto LAB_0025e437;
LAB_0025e42a:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_0025e437;
    }
    else {
      bVar8 = worm_known(level,mtmp);
      if (bVar8 != '\0') goto LAB_0025e3e4;
LAB_0025e437:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar18 = which_armor(mtmp,4), poVar18 == (obj *)0x0 ||
          (poVar18 = which_armor(mtmp,4), poVar18->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025e48b;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025e486;
        }
        else {
LAB_0025e486:
          if (ublindf != (obj *)0x0) {
LAB_0025e48b:
            if (ublindf->oartifact == '\x1d') goto LAB_0025e51e;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0025e585;
        }
LAB_0025e51e:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar12 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar12 < 0x41))))
        goto LAB_0025e585;
      }
      if ((u.uprops[0x42].intrinsic == 0) &&
         ((u.uprops[0x42].extrinsic == 0 && (bVar8 = match_warn_of_mon(mtmp), bVar8 == '\0'))))
      goto LAB_0025e5a7;
    }
LAB_0025e585:
    if ((((flags.safe_dog != '\0') && (u.uprops[0x1c].intrinsic == 0)) &&
        (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar8 = dmgtype(youmonst.data,0x24), bVar8 != '\0')))))) &&
       ((((u.uprops[0x1b].intrinsic == 0 && (u.umonnum != 0x9e)) &&
         ((youmonst.data)->mlet != '\x1c')) &&
        ((flags.forcefight == '\0' && ((uwep == (obj *)0x0 || (uwep->oartifact != '\x03')))))))) {
      uVar13 = mt_random();
      if (uVar13 % 7 == 0) {
        bVar24 = true;
      }
      else {
        ppVar6 = mtmp->data;
        bVar24 = ppVar6 == mons + 0x158 || (ppVar6 == mons + 0x76 || ppVar6 == mons + 0x74);
      }
      pcVar19 = in_rooms(level,mtmp->mx,mtmp->my,0x12);
      do {
        if ((long)*pcVar19 == 0) {
          if ((!bVar24) &&
             (('\x10' < level->locations[u.ux][u.uy].typ || ((mtmp->data->mflags1 & 8) != 0)))) {
            if ((mtmp->mfrozen == '\0') &&
               (((mtmp->field_0x62 & 4) != 0 && (mtmp->data->mmove != '\0')))) {
              return '\0';
            }
            uVar13 = mt_random();
            if (uVar13 % 6 == 0) {
              return '\0';
            }
            Monnam(mtmp);
            pcVar19 = "%s doesn\'t seem to move!";
            goto LAB_00260673;
          }
          break;
        }
        bVar8 = tended_shop((mkroom *)((long)level->monsters + (long)*pcVar19 * 0xd8 + 0x3358));
        pcVar19 = pcVar19 + 1;
      } while (bVar8 == '\0');
      iVar12 = rnd(6);
      monflee(mtmp,iVar12,'\0','\0');
      pcVar19 = y_monnam(mtmp);
      strcpy(buf,pcVar19);
      cVar11 = highc(buf[0]);
      buf[0] = cVar11;
      pcVar19 = "You stop.  %s is in the way!";
LAB_00260673:
      pline(pcVar19);
      nomul(0,(char *)0x0);
      return '\x01';
    }
  }
LAB_0025e5a7:
  override_confirmation = 0;
  dx_00 = (char)uVar25;
  bVar8 = attack_checks(mtmp,uwep,dx_00,cVar11,'\0');
  if (bVar8 != '\0') {
    return '\x01';
  }
  local_1d0[0] = (int)cVar11;
  local_1d0[1] = (int)dx_00;
  cVar26 = cVar11;
  if ((u.umonnum != u.umonster) && (iVar12 = noattacks(youmonst.data), iVar12 != 0)) {
    pline("You have no way to attack monsters physically.");
    goto LAB_002602b6;
  }
  bVar8 = check_capacity("You cannot fight while so heavily loaded.");
  if (bVar8 == '\0') {
    if ((u.twoweap != '\0') && (iVar12 = can_twoweapon(), iVar12 == 0)) {
      untwoweapon();
    }
    if ((unweapon != '\0') && (unweapon = '\0', flags.verbose != '\0')) {
      if (uwep == (obj *)0x0) {
        if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
          pcVar19 = "bash";
          if (urole.malenum == 0x160) {
            pcVar19 = "strik";
          }
          local_1d4 = (uint)CONCAT71(in_register_00000031,dx);
          pcVar28 = "gloved";
          if (uarmg == (obj *)0x0) {
            pcVar28 = "bare";
          }
          pcVar20 = body_part(6);
          pcVar20 = makeplural(pcVar20);
          uVar25 = (ulong)local_1d4;
          pline("You begin %sing monsters with your %s %s.",pcVar19,pcVar28,pcVar20);
        }
      }
      else {
        pcVar19 = aobjnam(uwep,(char *)0x0);
        pline("You begin bashing monsters with your %s.",pcVar19);
      }
    }
    exercise(0,'\x01');
    u_wipe_engr(3);
    if ((((ppVar6->mlet == '\f') && (mtmp->mfrozen == '\0')) &&
        ((*(uint *)&mtmp->field_0x60 & 0x2a0000) == 0x20000)) &&
       (uVar13 = mt_random(), uVar13 % 7 == 0)) {
      iVar12 = m_move(mtmp,0);
      if (iVar12 == 2) {
        return '\0';
      }
      if ((u.ux + local_1d0[1] != (int)mtmp->mx) || (u.uy + local_1d0[0] != (int)mtmp->my)) {
        return '\0';
      }
    }
    sVar9 = find_roll_to_hit(mtmp);
    iVar7 = u.umonnum;
    iVar12 = u.umonster;
    local_1e4 = (int)sVar9;
    if ((u.umonnum != u.umonster) || (urace.malenum == 0xe8)) {
      local_1d4 = (uint)uVar25;
      dhit = 0;
      uVar25 = 0;
      local_1e8 = (uint)CONCAT71(in_register_00000011,dy);
LAB_0025ea1e:
      cVar26 = (char)uVar27;
      uVar13 = 1;
      if (uVar25 == 6) goto LAB_002602ab;
      sum[uVar25] = 0;
      paVar21 = getmattk(youmonst.data,(int)uVar25,sum,&alt_attk);
      uVar30 = paVar21->aatyp;
      uVar17 = 1;
      switch(uVar30) {
      case '\0':
      case '\x0e':
        goto switchD_0025ea7f_caseD_0;
      case '\x01':
        if (uwep == (obj *)0x0 || uVar25 != 0) {
          if (uVar25 != 1 || uwep == (obj *)0x0) goto switchD_0025ea7f_caseD_2;
          if (u.umonnum - 0x12fU < 2) goto LAB_0025ef39;
          goto LAB_0025ed88;
        }
        if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0'))
        goto LAB_0025ef39;
        break;
      case '\x02':
switchD_0025ea7f_caseD_2:
        if (uVar25 != 0) {
LAB_0025ed88:
          if ((((youmonst.data)->mlet == '0') || (((youmonst.data)->mflags2 & 0x100) != 0)) &&
             ((((u.uprops[0x1b].intrinsic == 0 &&
                ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))) &&
               (u.uprops[0x1c].intrinsic == 0)) &&
              (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
               ((u.umonnum != u.umonster && (bVar8 = dmgtype(youmonst.data,0x24), bVar8 != '\0')))))
              ))) {
            ppVar6 = mtmp->data;
            iVar16 = (int)ppVar6;
            iVar14 = (int)((ulong)ppVar6 >> 0x20);
            auVar41._0_4_ = -(uint)(iVar16 == 0x3042f0);
            auVar41._4_4_ = -(uint)(iVar14 == 0);
            auVar41._8_4_ = -(uint)(iVar16 == 0x302ef0);
            auVar41._12_4_ = -(uint)(iVar14 == 0);
            auVar43._4_4_ = auVar41._0_4_;
            auVar43._0_4_ = auVar41._4_4_;
            auVar43._8_4_ = auVar41._12_4_;
            auVar43._12_4_ = auVar41._8_4_;
            auVar39._0_4_ = -(uint)(iVar16 == 0x2ffc30);
            auVar39._4_4_ = -(uint)(iVar14 == 0);
            auVar39._8_4_ = -(uint)(iVar16 == 0x2ffbf0);
            auVar39._12_4_ = -(uint)(iVar14 == 0);
            auVar42._4_4_ = auVar39._0_4_;
            auVar42._0_4_ = auVar39._4_4_;
            auVar42._8_4_ = auVar39._12_4_;
            auVar42._12_4_ = auVar39._8_4_;
            auVar43 = packssdw(auVar42 & auVar39,auVar43 & auVar41);
            auVar34._0_4_ = -(uint)(iVar16 == 0x304a70);
            auVar34._4_4_ = -(uint)(iVar14 == 0);
            auVar34._8_4_ = -(uint)(iVar16 == 0x302ff0);
            auVar34._12_4_ = -(uint)(iVar14 == 0);
            auVar36._4_4_ = auVar34._0_4_;
            auVar36._0_4_ = auVar34._4_4_;
            auVar36._8_4_ = auVar34._12_4_;
            auVar36._12_4_ = auVar34._8_4_;
            auVar46._0_4_ = -(uint)(iVar16 == 0x304a30);
            auVar46._4_4_ = -(uint)(iVar14 == 0);
            auVar46._8_4_ = -(uint)(iVar16 == 0x304ab0);
            auVar46._12_4_ = -(uint)(iVar14 == 0);
            auVar32._4_4_ = auVar46._0_4_;
            auVar32._0_4_ = auVar46._4_4_;
            auVar32._8_4_ = auVar46._12_4_;
            auVar32._12_4_ = auVar46._8_4_;
            auVar32 = packssdw(auVar32 & auVar46,auVar36 & auVar34);
            auVar32 = packssdw(auVar32,auVar43);
            if (((((((((auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                      (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar32[0xf] < '\0') || ppVar6 == mons + 299) goto LAB_0025fe94;
          }
        }
        break;
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
        break;
      case '\a':
        dhit = 1;
        wakeup(mtmp);
        if (mtmp->data == mons + 299) {
          pcVar19 = mon_nam(mtmp);
          pcVar28 = "Your hug passes harmlessly through %s.";
LAB_0025f4ae:
          pline(pcVar28,pcVar19);
          goto LAB_0025fe94;
        }
        bVar8 = sticks(mtmp->data);
        if ((bVar8 != '\0') || ((u._1052_1_ & 1) != 0)) goto LAB_0025fe94;
        if (u.ustuck == mtmp) {
          pcVar19 = Monnam(mtmp);
          pcVar28 = "crushed";
          if (u.umonnum == 0x102) {
            pcVar28 = "choked";
          }
          pline("%s is being %s.",pcVar19,pcVar28);
        }
        else {
          if (((uVar25 < 2) || (sum[uVar25 - 1] == 0)) || (local_1d0[uVar25] == 0))
          goto LAB_0025fe94;
          pcVar19 = mon_nam(mtmp);
          pline("You grab %s!",pcVar19);
          u.ustuck = mtmp;
        }
        goto LAB_0025f2e2;
      case '\b':
      case '\t':
switchD_0025ea7f_caseD_8:
        warning("strange attack of yours (%d)");
        goto LAB_0025fe94;
      case '\n':
      case '\f':
      case '\x0f':
        dhit = 0;
        goto LAB_0025fead;
      case '\v':
        iVar16 = rnd((int)uVar25 + 0x14);
        dhit = (int)(iVar16 < local_1e4);
        if (local_1e4 <= iVar16) goto LAB_0025f12b;
        wakeup(mtmp);
        if (mtmp->data == mons + 299) {
          pcVar19 = mon_nam(mtmp);
          pcVar28 = "Your attempt to surround %s is harmless.";
          goto LAB_0025f4ae;
        }
        uVar13 = dice((uint)paVar21->damn,(uint)paVar21->damd);
        if (3 < mtmp->data->msize) {
          pcVar19 = Monnam(mtmp);
          pcVar28 = "%s is too large to be engulfed.";
          goto LAB_0025ebf8;
        }
        if ((0x5db < u.uhunger) || ((u._1052_1_ & 1) != 0)) goto LAB_0025fe8e;
        poVar18 = (obj *)&mtmp->minvent;
        local_1d8 = uVar13;
        while (poVar18 = poVar18->nobj, poVar18 != (obj *)0x0) {
          snuff_lit(poVar18);
        }
        ppVar6 = mtmp->data;
        if (ppVar6 == mons + 0xc) {
          if (u.uprops[8].extrinsic == 0) goto LAB_0025f6f0;
        }
        else {
          if ((ppVar6 == mons + 0xb) && (u.uprops[8].extrinsic == 0)) {
LAB_0025f6f0:
            if (((byte)youmonst.mintrinsics & 0x80) == 0) {
              pcVar19 = mon_nam(mtmp);
              pline("You bite into %s.",pcVar19);
              pcVar19 = mons_mname(mtmp->data);
              pcVar19 = an(pcVar19);
              sprintf(buf,"swallowing %s whole",pcVar19);
              delayed_petrify((char *)0x0,buf);
              goto LAB_0025fe8e;
            }
          }
          if (ppVar6 == mons + 0xdb) {
            if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
              if (((byte)youmonst.mintrinsics & 8) == 0) goto LAB_0025fb59;
            }
            else if (((((u.uprops[4].intrinsic >> 0x1a & 1) != 0) &&
                      ((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0)) &&
                     (((byte)youmonst.mintrinsics & 8) == 0)) &&
                    (uVar17 = mt_random(), uVar17 % 10 == 0)) {
LAB_0025fb59:
              pcVar19 = mon_nam(mtmp);
              pline("You bite into %s.",pcVar19);
              pcVar19 = mons_mname(mtmp->data);
              pcVar19 = an(pcVar19);
              sprintf(buf,"swallowing %s whole",pcVar19);
              instadisintegrate(buf);
              goto LAB_0025fe8e;
            }
          }
        }
        local_1e0 = (ulong)uVar13;
        if ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
              (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
            (u.uprops[0xd].blocked != 0)) ||
           ((u.uprops[0xc].intrinsic != 0 ||
            ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) {
          cVar26 = mtmp->mx;
          cVar3 = mtmp->my;
          map_location((int)u.ux,(int)u.uy,1);
          lev = level;
          if ((u.uprops[0x23].intrinsic == 0) ||
             ((u.uprops[0x24].extrinsic != 0 ||
              ((u.umonnum != u.umonster && (bVar8 = dmgtype(youmonst.data,0x24), bVar8 != '\0'))))))
          {
            iVar16 = (int)youmonst.mnum;
          }
          else {
            iVar16 = display_rng(0x193);
          }
          dbuf_set(lev,(int)cVar26,(int)cVar3,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,iVar16 + 1,0,0);
        }
        pcVar19 = mon_nam(mtmp);
        pline("You engulf %s!",pcVar19);
        (*windowprocs.win_delay)();
        (*windowprocs.win_delay)();
        ppVar6 = youmonst.data;
        switch(paVar21->adtyp) {
        case '\0':
          pcVar19 = Monnam(mtmp);
          if (ppVar6 != mons + 0x6e) {
            pline("%s is pummeled with your debris!",pcVar19);
            goto switchD_0025f9fb_caseD_1;
          }
          pline("%s is laden with your moisture.",pcVar19);
          ppVar6 = mtmp->data;
          uVar13 = (uint)local_1e0;
          if ((ppVar6 != mons + 0x157 &&
              (ppVar6 != mons + 0xa0 && (ppVar6 != mons + 0x20 && ppVar6 != mons + 0x73))) &&
              (ppVar6->mflags1 & 0x600) != 0) {
            pcVar19 = Monnam(mtmp);
            pcVar28 = "%s seems unharmed.";
            goto LAB_0025fdcd;
          }
          break;
        case '\x01':
        case '\x04':
        case '\x05':
        case '\a':
        case '\t':
        case '\n':
switchD_0025f9fb_caseD_1:
          uVar13 = (uint)local_1e0;
          break;
        case '\x02':
          uVar13 = mt_random();
          if ((uVar13 & 1) == 0) goto LAB_0025fcb4;
          uVar4 = mtmp->mintrinsics;
          pcVar28 = Monnam(mtmp);
          uVar4 = uVar4 & 1;
          pcVar19 = "%s seems mildly hot.";
          pcVar20 = "%s is burning to a crisp!";
LAB_0025fd1a:
          if (uVar4 == 0) {
            pcVar19 = pcVar20;
          }
          uVar13 = local_1d8;
          if (uVar4 != 0) {
            uVar13 = 0;
          }
          pline(pcVar19,pcVar28);
          golemeffects(mtmp,(uint)paVar21->adtyp,uVar13);
          break;
        case '\x03':
          uVar13 = mt_random();
          if ((uVar13 & 1) != 0) {
            uVar4 = mtmp->mintrinsics;
            pcVar28 = Monnam(mtmp);
            uVar4 = uVar4 & 2;
            pcVar19 = "%s seems mildly chilly.";
            pcVar20 = "%s is freezing to death!";
            goto LAB_0025fd1a;
          }
          goto LAB_0025fcb4;
        case '\x06':
          uVar13 = mt_random();
          if ((uVar13 & 1) == 0) goto LAB_0025fcb4;
          pcVar19 = mon_nam(mtmp);
          pline("The air around %s crackles with electricity.",pcVar19);
          if ((mtmp->mintrinsics & 0x10) != 0) {
            pcVar19 = Monnam(mtmp);
            local_1e0 = 0;
            pline("%s seems unhurt.",pcVar19);
          }
          uVar13 = (uint)local_1e0;
          golemeffects(mtmp,(uint)paVar21->adtyp,uVar13);
          break;
        case '\b':
          pcVar19 = Monnam(mtmp);
          pline("%s is covered with your goo!",pcVar19);
          uVar13 = (uint)local_1e0;
          if ((mtmp->mintrinsics & 0x40) != 0) {
            pcVar19 = mon_nam(mtmp);
            pcVar28 = "It seems harmless to %s.";
LAB_0025fdcd:
            uVar13 = 0;
            pline(pcVar28,pcVar19);
          }
          break;
        case '\v':
          bVar8 = can_blnd(&youmonst,mtmp,paVar21->aatyp,(obj *)0x0);
          if (bVar8 != '\0') {
            uVar13 = *(uint *)&mtmp->field_0x60;
            if ((uVar13 >> 0x11 & 1) != 0) {
              pcVar19 = Monnam(mtmp);
              pline("%s can\'t see in there!",pcVar19);
              uVar13 = *(uint *)&mtmp->field_0x60;
            }
            *(uint *)&mtmp->field_0x60 = uVar13 & 0xfffdffff;
            iVar16 = local_1d8 + mtmp->mblinded;
            uVar30 = (uchar)iVar16;
            if (0x7e < iVar16) {
              uVar30 = '\x7f';
            }
            mtmp->mblinded = uVar30;
          }
LAB_0025fcb4:
          uVar13 = 0;
          break;
        default:
          uVar13 = (uint)local_1e0;
          if (paVar21->adtyp != '\x1a') break;
          ppVar6 = mtmp->data;
          if (ppVar6 == mons + 0x145 || (ppVar6 == mons + 0x146 || ppVar6 == mons + 0x144)) {
            pline("Unfortunately, digesting any of it is fatal.");
            end_engulf(mtmp);
            pcVar19 = mons_mname(mtmp->data);
            sprintf(gulpum_msgbuf,"unwisely tried to eat %s",pcVar19);
            killer = gulpum_msgbuf;
            killer_format = 2;
            done(0);
            goto LAB_0025fe8e;
          }
          if (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) {
            uVar13 = 0;
            break;
          }
          bVar10 = ppVar6->mlet;
          uVar23 = (ulong)bVar10;
          if ((uVar23 < 0x21) &&
             (((0x102400404U >> (uVar23 & 0x3f) & 1) != 0 ||
              ((uVar23 == 0x1f && (ppVar6 != mons + 0x9e)))))) {
LAB_0025ff57:
            iVar16 = 5;
          }
          else if (((ppVar6 != mons + 0x104 && ppVar6 != mons + 0x106) && bVar10 == 0x37) ||
                  ((bVar10 == 0x36 || ((iVar16 = 7, bVar10 == 0x2a && (ppVar6 != mons + 0xd6)))))) {
            if ((bVar10 == 0x36) ||
               (iVar16 = 6, (ppVar6 != mons + 0x106 && ppVar6 != mons + 0x104) && bVar10 == 0x37))
            goto LAB_0025ff57;
          }
          violated(iVar16);
          poVar18 = mlifesaver(mtmp);
          if (poVar18 != (obj *)0x0) {
            m_useup(mtmp,poVar18);
          }
          newuhs('\0');
          xkilled(mtmp,2);
          if (mtmp->mhp < 1) {
            bVar10 = *(byte *)((long)&mtmp->data->cwt + 1);
            bVar8 = corpse_chance(mtmp,&youmonst,'\x01');
            iVar16 = 0;
            if ((bVar8 != '\0') &&
               (iVar14 = monsndx(mtmp->data), iVar16 = 0, (mvitals[iVar14].mvflags & 0x10) == 0)) {
              iVar16 = bVar10 + 1;
              u.uhunger = u.uhunger + (mtmp->data->cnutrit + 1 >> 1);
            }
            pcVar19 = mon_nam(mtmp);
            sprintf(gulpum_msgbuf,"You totally digest %s.",pcVar19);
            if (iVar16 == 0) {
              pline("%s",gulpum_msgbuf);
            }
            else {
              pcVar19 = mon_nam(mtmp);
              pline("You digest %s.",pcVar19);
              nomul(-(iVar16 << (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0)),
                    "digesting something");
              nomovemsg = gulpum_msgbuf;
            }
            if (mtmp->data == mons + 0xd7) {
              pcVar19 = mons_mname(mons + 0xd7);
              pcVar19 = The(pcVar19);
              sprintf(gulpum_msgbuf,"%s isn\'t sitting well with you.",pcVar19);
              if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
                u.uprops[0x3a].intrinsic = 5;
                iflags.botl = '\x01';
              }
            }
            else {
              exercise(4,'\x01');
            }
          }
          else {
            pcVar19 = body_part(0x12);
            pline("You hurriedly regurgitate the sizzling in your %s.",pcVar19);
          }
          end_engulf(mtmp);
          goto LAB_002601b9;
        }
        end_engulf(mtmp);
        piVar1 = &mtmp->mhp;
        iVar16 = *piVar1;
        *piVar1 = *piVar1 - uVar13;
        if ((*piVar1 == 0 || SBORROW4(iVar16,uVar13) != *piVar1 < 0) &&
           (killed(mtmp), mtmp->mhp < 1)) {
LAB_002601b9:
          sum[uVar25] = 2;
          cVar26 = mtmp->data->mlet;
          if ((((cVar26 == '4') || (cVar26 == '\'')) && (uVar13 = mt_random(), uVar13 % 5 != 0)) &&
             (((u.uprops[0x34].intrinsic == 0 &&
               (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
              (bVar8 = defends(0x21,uwep), bVar8 == '\0')))) {
            pcVar19 = "very ";
            if (u.uprops[0x1d].intrinsic == 0) {
              pcVar19 = "";
            }
            pline("You feel %ssick.",pcVar19);
            iVar16 = rnd(8);
            mdamageu(mtmp,iVar16);
          }
        }
        else {
          pcVar19 = "regurgitate";
          if (((youmonst.data)->mflags1 >> 0x12 & 1) == 0) {
            pcVar19 = "expel";
          }
          pcVar28 = mon_nam(mtmp);
          pline("You %s %s!",pcVar19,pcVar28);
          if ((u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) ||
             (((youmonst.data)->mflags1 & 0x40000) != 0)) {
            pcVar19 = mon_nam(mtmp);
            pcVar19 = s_suffix(pcVar19);
            pcVar28 = "Obviously, you didn\'t like %s taste.";
LAB_0025ebf8:
            pline(pcVar28,pcVar19);
          }
LAB_0025fe8e:
          sum[uVar25] = 0;
        }
        goto LAB_0025fe94;
      case '\r':
        dhit = -1;
        wakeup(mtmp);
        iVar16 = dice((uint)paVar21->damn,(uint)paVar21->damd);
        pline("You explode!");
        uVar5 = local_1e8;
        switch(paVar21->adtyp) {
        case '\x02':
          bVar10 = (byte)mtmp->mintrinsics;
          goto LAB_0025f527;
        case '\x03':
          bVar10 = (byte)mtmp->mintrinsics >> 1;
          goto LAB_0025f527;
        case '\x04':
        case '\x05':
        case '\a':
        case '\b':
        case '\t':
        case '\n':
          break;
        case '\x06':
          bVar10 = (byte)mtmp->mintrinsics >> 4;
LAB_0025f527:
          if ((bVar10 & 1) == 0) {
            pcVar19 = Monnam(mtmp);
            pline("%s gets blasted!",pcVar19);
            piVar1 = &mtmp->mhp;
            iVar14 = *piVar1;
            *piVar1 = *piVar1 - iVar16;
            uVar13 = uVar17;
            if (*piVar1 == 0 || SBORROW4(iVar14,iVar16) != *piVar1 < 0) {
              killed(mtmp);
              uVar13 = 2;
            }
          }
          else {
            shieldeff(mtmp->mx,mtmp->my);
            if (mtmp->data->mlet == '7') {
              golemeffects(mtmp,(uint)paVar21->adtyp,iVar16);
              uVar13 = uVar17;
            }
            else {
              pcVar19 = mon_nam(mtmp);
              pline("The blast doesn\'t seem to affect %s.",pcVar19);
              uVar13 = uVar17;
            }
          }
          break;
        case '\v':
          bVar8 = resists_blnd(mtmp);
          uVar13 = uVar17;
          if (bVar8 == '\0') {
            pcVar19 = Monnam(mtmp);
            pline("%s is blinded by your flash of light!",pcVar19);
            iVar16 = iVar16 + (uint)mtmp->mblinded;
            uVar30 = (uchar)iVar16;
            if (0x7e < iVar16) {
              uVar30 = '\x7f';
            }
            mtmp->mblinded = uVar30;
            mtmp->field_0x62 = mtmp->field_0x62 & 0xfd;
          }
          break;
        default:
          uVar13 = uVar17;
          if (((paVar21->adtyp == '$') && ((mtmp->data->mflags1 & 0x1000) == 0)) &&
             ((mtmp->field_0x62 & 2) != 0)) {
            pcVar19 = Monnam(mtmp);
            pline("%s is affected by your flash of light!",pcVar19);
            mtmp->field_0x62 = mtmp->field_0x62 | 0x20;
          }
        }
        uVar27 = (ulong)uVar5;
        sum[uVar25] = uVar13;
        goto LAB_0025fe94;
      case '\x10':
        poVar18 = uwep;
        goto LAB_0025ef12;
      default:
        if (uVar30 != 0xfe) {
          if (uVar30 != 0xff) goto switchD_0025ea7f_caseD_8;
          if (((uVar25 != 0) || (0x21 < (ulong)(byte)(youmonst.data)->mlet)) ||
             ((0x200008800U >> ((ulong)(byte)(youmonst.data)->mlet & 0x3f) & 1) == 0))
          goto switchD_0025ea7f_caseD_0;
        }
        goto LAB_0025ef39;
      }
      if (uwep == (obj *)0x0 || uVar25 != 0) {
        if (uwep != (obj *)0x0) {
LAB_0025eae1:
          ppVar6 = mtmp->data;
          poVar18 = uwep;
          if (ppVar6 != mons + 0x127 && (ppVar6 != mons + 0xb && ppVar6 != mons + 0xc))
          goto LAB_0025ef12;
          goto LAB_0025fe94;
        }
        if (u.twoweap == '\0') {
          poVar18 = (obj *)0x0;
        }
        else {
          poVar18 = (obj *)0x0;
          if (uswapwep != (obj *)0x0) goto LAB_0025eae1;
        }
LAB_0025ef12:
        if (((uVar25 == 0) && (poVar18 != (obj *)0x0)) && ((youmonst.data)->mlet == '&'))
        goto LAB_0025ef39;
        if (((((u.umonnum != 0x9e && u.uprops[0x1b].intrinsic == 0) &&
               (youmonst.data == mons + 0x32 || youmonst.data == mons + 0x31)) &&
             ((youmonst.data)->mlet != '\x1c')) && (u.uprops[0x1c].intrinsic == 0)) &&
           (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
            ((u.umonnum != u.umonster && (bVar8 = dmgtype(youmonst.data,0x24), bVar8 != '\0')))))) {
          ppVar6 = mtmp->data;
          iVar16 = (int)ppVar6;
          iVar14 = (int)((ulong)ppVar6 >> 0x20);
          auVar44._0_4_ = -(uint)(iVar16 == 0x3042f0);
          auVar44._4_4_ = -(uint)(iVar14 == 0);
          auVar44._8_4_ = -(uint)(iVar16 == 0x302ef0);
          auVar44._12_4_ = -(uint)(iVar14 == 0);
          auVar37._4_4_ = auVar44._0_4_;
          auVar37._0_4_ = auVar44._4_4_;
          auVar37._8_4_ = auVar44._12_4_;
          auVar37._12_4_ = auVar44._8_4_;
          auVar40._0_4_ = -(uint)(iVar16 == 0x2ffc30);
          auVar40._4_4_ = -(uint)(iVar14 == 0);
          auVar40._8_4_ = -(uint)(iVar16 == 0x2ffbf0);
          auVar40._12_4_ = -(uint)(iVar14 == 0);
          auVar45._4_4_ = auVar40._0_4_;
          auVar45._0_4_ = auVar40._4_4_;
          auVar45._8_4_ = auVar40._12_4_;
          auVar45._12_4_ = auVar40._8_4_;
          auVar46 = packssdw(auVar45 & auVar40,auVar37 & auVar44);
          auVar35._0_4_ = -(uint)(iVar16 == 0x304a70);
          auVar35._4_4_ = -(uint)(iVar14 == 0);
          auVar35._8_4_ = -(uint)(iVar16 == 0x302ff0);
          auVar35._12_4_ = -(uint)(iVar14 == 0);
          auVar38._4_4_ = auVar35._0_4_;
          auVar38._0_4_ = auVar35._4_4_;
          auVar38._8_4_ = auVar35._12_4_;
          auVar38._12_4_ = auVar35._8_4_;
          auVar33._0_4_ = -(uint)(iVar16 == 0x304a30);
          auVar33._4_4_ = -(uint)(iVar14 == 0);
          auVar33._8_4_ = -(uint)(iVar16 == 0x304ab0);
          auVar33._12_4_ = -(uint)(iVar14 == 0);
          auVar31._4_4_ = auVar33._0_4_;
          auVar31._0_4_ = auVar33._4_4_;
          auVar31._8_4_ = auVar33._12_4_;
          auVar31._12_4_ = auVar33._8_4_;
          auVar32 = packssdw(auVar31 & auVar33,auVar38 & auVar35);
          auVar32 = packssdw(auVar32,auVar46);
          if (((((((((auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar32[0xf] < '\0') || ppVar6 == mons + 299) goto LAB_0025fe94;
        }
        iVar16 = rnd(0x14);
        dhit = (byte)(iVar16 < local_1e4 | u._1052_1_) & 1;
        if (local_1e4 <= iVar16 && (u._1052_1_ & 1) == 0) {
LAB_0025f12b:
          missum(mtmp,paVar21);
          goto LAB_0025fead;
        }
        if (((u._1052_1_ & 1) == 0) && (iVar16 = could_seduce(&youmonst,mtmp,paVar21), iVar16 != 0))
        {
          pcVar19 = "talk to";
          if (((mtmp->field_0x62 & 2) != 0) &&
             (pcVar19 = "talk to", (mtmp->data->mflags1 & 0x1000) == 0)) {
            pcVar19 = "smile at";
          }
          pcVar28 = mon_nam(mtmp);
          pcVar20 = "seductively";
          if (iVar16 == 2) {
            pcVar20 = "engagingly";
          }
          pline("You %s %s %s.",pcVar19,pcVar28,pcVar20);
          iVar16 = damageum(mtmp,paVar21);
          sum[uVar25] = iVar16;
          uVar27 = (ulong)local_1e8;
        }
        else {
          wakeup(mtmp);
          if (mtmp->data == mons + 299) {
            if ((uarmf == (obj *)0x0 || paVar21->aatyp != '\x03') ||
               (pcVar19 = "You kick %s.", (uarmf->field_0x4a & 2) == 0)) {
              pcVar19 = mon_nam(mtmp);
              pline("Your attack passes harmlessly through %s.",pcVar19);
              goto LAB_0025fe94;
            }
          }
          else {
            bVar10 = paVar21->aatyp - 2;
            pcVar19 = "You hit %s.";
            if (bVar10 < 0xf) {
              pcVar19 = &DAT_002c1894 + *(int *)(&DAT_002c1894 + (ulong)bVar10 * 4);
            }
          }
          pcVar28 = mon_nam(mtmp);
          pline(pcVar19,pcVar28);
          if (((mtmp->data == mons + 0xdb) && ((mtmp->field_0x61 & 1) == 0)) && (1 < mtmp->mhp)) {
            uVar30 = paVar21->aatyp;
            if (uarmf == (obj *)0x0 || uVar30 != '\x03') {
              if ((uarmg == (obj *)0x0) ||
                 (((uVar30 != '\x01' && (uVar30 != 0xfe)) && (uVar30 != '\x05')))) {
                if (uarmh == (obj *)0x0 || uVar30 != '\x04') {
                  pcVar19 = mons_mname(mons + 0xdb);
                  pcVar19 = an(pcVar19);
                  sprintf(buf,"touching %s",pcVar19);
                  iVar16 = instadisintegrate(buf);
                  mtmp->mhp = mtmp->mhp - iVar16;
                }
                else if ((objects[uarmh->otyp].oc_oprop != '\x04') &&
                        (bVar8 = obj_resists(uarmh,5,0x32), bVar8 == '\0')) {
                  ppoVar29 = &uarmh;
                  goto LAB_0025f8b4;
                }
              }
              else if ((objects[uarmg->otyp].oc_oprop != '\x04') &&
                      (bVar8 = obj_resists(uarmg,5,0x32), bVar8 == '\0')) {
                ppoVar29 = &uarmg;
                goto LAB_0025f8b4;
              }
LAB_0025fa6d:
              sum[uVar25] = 1;
              uVar17 = 0;
            }
            else {
              if ((objects[uarmf->otyp].oc_oprop == '\x04') ||
                 (bVar8 = obj_resists(uarmf,5,0x32), bVar8 != '\0')) goto LAB_0025fa6d;
              ppoVar29 = &uarmf;
LAB_0025f8b4:
              bVar8 = is_quest_artifact(*ppoVar29);
              if (bVar8 != '\0') goto LAB_0025fa6d;
              uVar5 = (*ppoVar29)->owt;
              uVar17 = 0;
              destroy_arm(*ppoVar29,'\0');
              sum[uVar25] = 1;
              if (uVar5 != 0) {
                uVar17 = uVar5 / 100;
                if ((int)uVar5 < 0x65) {
                  uVar17 = uVar13;
                }
                uVar17 = rnd(uVar17);
                if (5 < uVar17) {
                  uVar17 = 6;
                }
              }
            }
            uVar17 = mtmp->mhp - uVar17;
            if ((int)uVar17 < 2) {
              uVar17 = uVar13;
            }
            mtmp->mhp = uVar17;
          }
          else {
            iVar16 = damageum(mtmp,paVar21);
            sum[uVar25] = iVar16;
          }
        }
      }
      else {
        if ((youmonst.data)->mlet != '&') goto LAB_0025eae1;
LAB_0025ef39:
        iVar14 = hitval(uwep,mtmp);
        iVar15 = weapon_hit_bonus(uwep);
        iVar16 = local_1e4;
        iVar15 = iVar14 + local_1e4 + iVar15;
        dieroll = rnd(0x14);
        dhit = (byte)(dieroll < iVar15 | u._1052_1_) & 1;
        local_1e4 = iVar16;
        if (uwep == (obj *)0x0) {
          local_1e4 = iVar15;
        }
        bVar8 = known_hitum(mtmp,&dhit,paVar21,(schar)local_1d0[1],(schar)local_1d0[0]);
        if (bVar8 != '\0') {
          sum[uVar25] = dhit;
          pmVar22 = level->monsters[(long)u.ux + (long)dx_00][(long)u.uy + (long)cVar11];
          if (pmVar22 == (monst *)0x0) {
            pmVar22 = (monst *)0x0;
          }
          else if ((pmVar22->field_0x61 & 2) != 0) {
            pmVar22 = (monst *)0x0;
          }
          uVar27 = (ulong)local_1e8;
          cVar26 = (char)local_1e8;
          if (pmVar22 == mtmp) {
            if (((dhit != 0) && (paVar21->adtyp != '\0')) && (paVar21->adtyp != 0xf1)) {
LAB_0025f2e2:
              iVar16 = damageum(mtmp,paVar21);
              sum[uVar25] = iVar16;
            }
            goto LAB_0025fe94;
          }
          goto LAB_002602ab;
        }
        sum[uVar25] = 2;
        uVar27 = (ulong)local_1e8;
      }
LAB_0025fe94:
      if (dhit == -1) {
        u.mh = -1;
        rehumanize();
      }
LAB_0025fead:
      cVar26 = (char)uVar27;
      if (sum[uVar25] == 2) {
        passive(mtmp,'\x01',0,paVar21->aatyp);
        goto LAB_002602ab;
      }
      passive(mtmp,(boolean)sum[uVar25],1,paVar21->aatyp);
      if (((u.umonnum != u.umonster) != (iVar7 != iVar12)) || (multi < 0)) goto LAB_002602ab;
switchD_0025ea7f_caseD_0:
      uVar25 = uVar25 + 1;
      goto LAB_0025ea1e;
    }
    paVar21 = (youmonst.data)->mattk;
    dieroll = rnd(0x14);
    buf._0_4_ = (byte)(dieroll < local_1e4 | u._1052_1_) & 1;
    if (dieroll < local_1e4) {
      exercise(3,'\x01');
    }
    bVar8 = known_hitum(mtmp,(int *)buf,paVar21,(schar)local_1d0[1],(schar)local_1d0[0]);
    passive(mtmp,buf[0],(int)bVar8,0xfe);
    goto LAB_002602b6;
  }
  goto LAB_002602ba;
LAB_002602ab:
  uVar25 = (ulong)local_1d4;
LAB_002602b6:
  pbVar2 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar2 = *pbVar2 & 0xcf;
LAB_002602ba:
  if (flags.forcefight == '\0') {
    return '\x01';
  }
  if (mtmp->mhp < 1) {
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00260393;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00260336;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0026032d;
    }
    else {
LAB_0026032d:
      if (ublindf == (obj *)0x0) goto LAB_002603df;
LAB_00260336:
      if (ublindf->oartifact != '\x1d') goto LAB_002603df;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_00260393;
  }
  else {
    bVar8 = worm_known(level,mtmp);
    if (bVar8 != '\0') {
LAB_00260393:
      uVar13 = *(uint *)&mtmp->field_0x60;
      if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar13 & 0x280) == 0) goto LAB_002603d1;
      }
      else if (((uVar13 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002603d1:
        if ((u._1052_1_ & 0x20) == 0) {
          return '\x01';
        }
      }
    }
  }
LAB_002603df:
  if (((mtmp->data->mflags1 & 0x10000) != 0) ||
     ((poVar18 = which_armor(mtmp,4), poVar18 != (obj *)0x0 &&
      (poVar18 = which_armor(mtmp,4), poVar18->otyp == 0x4f)))) goto LAB_002604f2;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026042c;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00260427;
  }
  else {
LAB_00260427:
    if (ublindf != (obj *)0x0) {
LAB_0026042c:
      if (ublindf->oartifact == '\x1d') goto LAB_002604bf;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return '\x01';
    }
  }
LAB_002604bf:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar12 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar12 < 0x41)) {
    return '\x01';
  }
LAB_002604f2:
  if ((((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
      ((bVar8 = match_warn_of_mon(mtmp), bVar8 == '\0' &&
       ((level->locations[(long)dx_00 + (long)u.ux][(long)cVar11 + (long)u.uy].field_0x6 & 8) == 0))
      )) && (((u._1052_1_ & 1) == 0 || (u.ustuck != mtmp)))) {
    map_invisible(u.ux + (char)uVar25,u.uy + cVar26);
  }
  return '\x01';
}

Assistant:

boolean attack(struct monst *mtmp, schar dx, schar dy)
{
	schar tmp;
	const struct permonst *mdat = mtmp->data;

	/* This section of code provides protection against accidentally
	 * hitting peaceful (like '@') and tame (like 'd') monsters.
	 * Protection is provided as long as player is not: blind, confused,
	 * hallucinating or stunned.
	 * changes by wwp 5/16/85
	 * More changes 12/90, -dkh-. if its tame and safepet, (and protected
	 * 07/92) then we assume that you're not trying to attack. Instead,
	 * you'll usually just swap places if this is a movement command
	 */
	/* Intelligent chaotic weapons (Stormbringer) want blood */
	if (is_safepet(level, mtmp) && !flags.forcefight) {
	    if (!uwep || uwep->oartifact != ART_STORMBRINGER) {
		/* there are some additional considerations: this won't work
		 * if in a shop or you miss a random roll or
		 * if you can walk thru walls and your pet cannot (KAA) or
		 * if your pet is a long worm (unless someone does better).
		 * there's also a chance of displacing a "frozen" monster.
		 * sleeping monsters might magically walk in their sleep.
		 */
		boolean foo = (!rn2(7) || is_longworm(mtmp->data)),
			inshop = FALSE;
		char *p;

		for (p = in_rooms(level, mtmp->mx, mtmp->my, SHOPBASE); *p; p++)
		    if (tended_shop(&level->rooms[*p - ROOMOFFSET])) {
			inshop = TRUE;
			break;
		    }

		if (inshop || foo ||
			(IS_ROCK(level->locations[u.ux][u.uy].typ) &&
					!passes_walls(mtmp->data))) {
		    char buf[BUFSZ];

		    monflee(mtmp, rnd(6), FALSE, FALSE);
		    strcpy(buf, y_monnam(mtmp));
		    buf[0] = highc(buf[0]);
		    pline("You stop.  %s is in the way!", buf);
		    nomul(0, NULL);
		    return TRUE;
		} else if ((mtmp->mfrozen || (! mtmp->mcanmove)
				|| (mtmp->data->mmove == 0)) && rn2(6)) {
		    pline("%s doesn't seem to move!", Monnam(mtmp));
		    nomul(0, NULL);
		    return TRUE;
		} else return FALSE;
	    }
	}

	/* possibly set in attack_checks;
	   examined in known_hitum, called via hitum or hmonas below */
	override_confirmation = FALSE;
	if (attack_checks(mtmp, uwep, dx, dy, FALSE))
	    return TRUE;

	if (Upolyd) {
		/* certain "pacifist" monsters don't attack */
		if (noattacks(youmonst.data)) {
			pline("You have no way to attack monsters physically.");
			mtmp->mstrategy &= ~STRAT_WAITMASK;
			goto atk_done;
		}
	}

	if (check_capacity("You cannot fight while so heavily loaded."))
	    goto atk_done;

	if (u.twoweap && !can_twoweapon())
		untwoweapon();

	if (unweapon) {
	    unweapon = FALSE;
	    if (flags.verbose) {
		if (uwep)
		    pline("You begin bashing monsters with your %s.",
			aobjnam(uwep, NULL));
		else if (!cantwield(youmonst.data))
		    pline("You begin %sing monsters with your %s %s.",
			Role_if (PM_MONK) ? "strik" : "bash",
			uarmg ? "gloved" : "bare",	/* Del Lamb */
			makeplural(body_part(HAND)));
	    }
	}
	exercise(A_STR, TRUE);		/* you're exercising muscles */
	/* andrew@orca: prevent unlimited pick-axe attacks */
	u_wipe_engr(3);

	/* Is the "it died" check actually correct? */
	if (mdat->mlet == S_LEPRECHAUN && !mtmp->mfrozen && !mtmp->msleeping &&
	   !mtmp->mconf && mtmp->mcansee && !rn2(7) &&
	   (m_move(mtmp, 0) == 2 ||			    /* it died */
	   mtmp->mx != u.ux + dx || mtmp->my != u.uy + dy)) /* it moved */
		return FALSE;

	tmp = find_roll_to_hit(mtmp);
	if (Upolyd || Race_if(PM_VAMPIRE))
		hmonas(mtmp, tmp, dx, dy);
	else
		hitum(mtmp, tmp, youmonst.data->mattk, dx, dy);
	mtmp->mstrategy &= ~STRAT_WAITMASK;

atk_done:
	/* see comment in attack_checks() */
	/* we only need to check for this if we did an attack_checks()
	 * and it returned 0 (it's okay to attack), and the monster didn't
	 * evade.
	 */
	if (flags.forcefight && mtmp->mhp > 0 && !canspotmon(level, mtmp) &&
	    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
	    !(u.uswallow && mtmp == u.ustuck))
		map_invisible(u.ux+dx, u.uy+dy);

	return TRUE;
}